

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PrimitiveSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PrimitiveSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation_const&,slang::ast::PrimitiveSymbol::PrimitiveKind&>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2,
          PrimitiveKind *args_3)

{
  string_view name;
  PrimitiveSymbol *pPVar1;
  Compilation *in_RCX;
  PrimitiveSymbol *in_RDX;
  SourceLocation in_RSI;
  size_t in_RDI;
  BumpAllocator *in_R8;
  char *unaff_retaddr;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  pPVar1 = (PrimitiveSymbol *)allocate(in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  name._M_str = unaff_retaddr;
  name._M_len = in_RDI;
  slang::ast::PrimitiveSymbol::PrimitiveSymbol
            (in_RDX,in_RCX,name,in_RSI,(PrimitiveKind)((ulong)in_R8 >> 0x20));
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }